

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageSamplingInstance.cpp
# Opt level: O2

void vkt::pipeline::anon_unknown_0::swizzle
               (ConstPixelBufferAccess *src,PixelBufferAccess *dst,VkComponentMapping *swz)

{
  VkComponentMapping *pVVar1;
  bool bVar2;
  TextureChannelClass TVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int z;
  int iVar7;
  int x_00;
  int iVar8;
  int y;
  int x;
  int iVar9;
  UVec4 local_70;
  VkComponentMapping *local_60;
  PixelBufferAccess *local_58;
  tcu local_50 [32];
  
  local_60 = swz;
  TVar3 = tcu::getTextureChannelClass((dst->super_ConstPixelBufferAccess).m_format.type);
  x_00 = (int)src;
  local_58 = dst;
  if (TVar3 == TEXTURECHANNELCLASS_UNSIGNED_INTEGER) {
    for (iVar7 = 0; iVar7 < (dst->super_ConstPixelBufferAccess).m_size.m_data[2]; iVar7 = iVar7 + 1)
    {
      for (iVar8 = 0; iVar8 < (dst->super_ConstPixelBufferAccess).m_size.m_data[1];
          iVar8 = iVar8 + 1) {
        for (iVar9 = 0; iVar9 < (dst->super_ConstPixelBufferAccess).m_size.m_data[0];
            iVar9 = iVar9 + 1) {
          tcu::ConstPixelBufferAccess::getPixelT<unsigned_int>
                    ((ConstPixelBufferAccess *)local_50,x_00,iVar9,iVar8);
          pVVar1 = local_60;
          uVar4 = getSwizzledComp<unsigned_int>((Vector<unsigned_int,_4> *)local_50,local_60->r,0);
          uVar5 = getSwizzledComp<unsigned_int>((Vector<unsigned_int,_4> *)local_50,pVVar1->g,1);
          uVar6 = getSwizzledComp<unsigned_int>((Vector<unsigned_int,_4> *)local_50,pVVar1->b,2);
          local_70.m_data[3] =
               getSwizzledComp<unsigned_int>((Vector<unsigned_int,_4> *)local_50,pVVar1->a,3);
          dst = local_58;
          local_70.m_data[0] = uVar4;
          local_70.m_data[1] = uVar5;
          local_70.m_data[2] = uVar6;
          tcu::PixelBufferAccess::setPixel(local_58,&local_70,iVar9,iVar8,iVar7);
        }
      }
    }
  }
  else if (TVar3 == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
    for (iVar7 = 0; iVar7 < (dst->super_ConstPixelBufferAccess).m_size.m_data[2]; iVar7 = iVar7 + 1)
    {
      for (iVar8 = 0; iVar8 < (dst->super_ConstPixelBufferAccess).m_size.m_data[1];
          iVar8 = iVar8 + 1) {
        for (iVar9 = 0; iVar9 < (dst->super_ConstPixelBufferAccess).m_size.m_data[0];
            iVar9 = iVar9 + 1) {
          tcu::ConstPixelBufferAccess::getPixelT<int>
                    ((ConstPixelBufferAccess *)local_50,x_00,iVar9,iVar8);
          pVVar1 = local_60;
          uVar4 = getSwizzledComp<int>((Vector<int,_4> *)local_50,local_60->r,0);
          uVar5 = getSwizzledComp<int>((Vector<int,_4> *)local_50,pVVar1->g,1);
          uVar6 = getSwizzledComp<int>((Vector<int,_4> *)local_50,pVVar1->b,2);
          local_70.m_data[3] = getSwizzledComp<int>((Vector<int,_4> *)local_50,pVVar1->a,3);
          dst = local_58;
          local_70.m_data[0] = uVar4;
          local_70.m_data[1] = uVar5;
          local_70.m_data[2] = uVar6;
          tcu::PixelBufferAccess::setPixel(local_58,(IVec4 *)&local_70,iVar9,iVar8,iVar7);
        }
      }
    }
  }
  else {
    bVar2 = tcu::isSRGB(src->m_format);
    if ((bVar2) && (bVar2 = tcu::isSRGB((dst->super_ConstPixelBufferAccess).m_format), !bVar2)) {
      for (iVar7 = 0; iVar7 < (dst->super_ConstPixelBufferAccess).m_size.m_data[2];
          iVar7 = iVar7 + 1) {
        for (iVar8 = 0; iVar8 < (dst->super_ConstPixelBufferAccess).m_size.m_data[1];
            iVar8 = iVar8 + 1) {
          for (iVar9 = 0; iVar9 < (dst->super_ConstPixelBufferAccess).m_size.m_data[0];
              iVar9 = iVar9 + 1) {
            tcu::ConstPixelBufferAccess::getPixelT<float>
                      ((ConstPixelBufferAccess *)(local_50 + 0x10),x_00,iVar9,iVar8);
            tcu::sRGBToLinear(local_50,(Vec4 *)(local_50 + 0x10));
            swizzle<float>((anon_unknown_0 *)&local_70,(Vector<float,_4> *)local_50,local_60);
            tcu::PixelBufferAccess::setPixel(dst,(Vec4 *)&local_70,iVar9,iVar8,iVar7);
          }
        }
      }
      return;
    }
    for (iVar7 = 0; iVar7 < (dst->super_ConstPixelBufferAccess).m_size.m_data[2]; iVar7 = iVar7 + 1)
    {
      for (iVar8 = 0; iVar8 < (dst->super_ConstPixelBufferAccess).m_size.m_data[1];
          iVar8 = iVar8 + 1) {
        for (iVar9 = 0; iVar9 < (dst->super_ConstPixelBufferAccess).m_size.m_data[0];
            iVar9 = iVar9 + 1) {
          tcu::ConstPixelBufferAccess::getPixelT<float>
                    ((ConstPixelBufferAccess *)local_50,x_00,iVar9,iVar8);
          swizzle<float>((anon_unknown_0 *)&local_70,(Vector<float,_4> *)local_50,local_60);
          tcu::PixelBufferAccess::setPixel(dst,(Vec4 *)&local_70,iVar9,iVar8,iVar7);
        }
      }
    }
  }
  return;
}

Assistant:

void swizzle (const tcu::ConstPixelBufferAccess& src, const tcu::PixelBufferAccess& dst, const vk::VkComponentMapping& swz)
{
	const tcu::TextureChannelClass	chnClass	= tcu::getTextureChannelClass(dst.getFormat().type);

	DE_ASSERT(src.getWidth() == dst.getWidth() &&
			  src.getHeight() == dst.getHeight() &&
			  src.getDepth() == dst.getDepth());

	if (chnClass == tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER)
		swizzleT<deInt32>(src, dst, swz);
	else if (chnClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER)
		swizzleT<deUint32>(src, dst, swz);
	else if (tcu::isSRGB(src.getFormat()) && !tcu::isSRGB(dst.getFormat()))
		swizzleFromSRGB(src, dst, swz);
	else
		swizzleT<float>(src, dst, swz);
}